

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SwapInlinedStringDonated
          (Reflection *this,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  char *pcVar1;
  LogMessage *pLVar2;
  LogMessage local_e0;
  Voidify local_c9;
  uint local_c8;
  uint local_c4;
  Nullable<const_char_*> local_c0;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  undefined1 local_b0 [4];
  uint32_t index;
  Voidify local_99;
  uint local_98;
  uint local_94;
  Nullable<const_char_*> local_90;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_78;
  Voidify local_61;
  uint local_60;
  uint local_5c;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  uint32_t *rhs_array;
  uint32_t *lhs_array;
  bool rhs_donated;
  Arena *pAStack_38;
  bool lhs_donated;
  Arena *rhs_arena;
  Arena *lhs_arena;
  FieldDescriptor *field_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *this_local;
  
  lhs_arena = (Arena *)field;
  field_local = (FieldDescriptor *)rhs;
  rhs_local = lhs;
  lhs_local = (Message *)this;
  rhs_arena = MessageLite::GetArena(&lhs->super_MessageLite);
  pAStack_38 = MessageLite::GetArena((MessageLite *)field_local);
  if (rhs_arena == pAStack_38) {
    lhs_array._7_1_ = IsInlinedStringDonated(this,rhs_local,(FieldDescriptor *)lhs_arena);
    lhs_array._6_1_ =
         IsInlinedStringDonated(this,(Message *)field_local,(FieldDescriptor *)lhs_arena);
    if ((lhs_array._7_1_ & 1) != lhs_array._6_1_) {
      rhs_array = MutableInlinedStringDonatedArray(this,rhs_local);
      absl_log_internal_check_op_result =
           (Nullable<const_char_*>)MutableInlinedStringDonatedArray(this,(Message *)field_local);
      local_5c = absl::lts_20250127::log_internal::GetReferenceableValue(*rhs_array & 1);
      local_60 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
      local_58 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                           (&local_5c,&local_60,"lhs_array[0] & 0x1u == 0u");
      if (local_58 != (Nullable<const_char_*>)0x0) {
        pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_58);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0xbe0,pcVar1);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_78);
      }
      local_94 = absl::lts_20250127::log_internal::GetReferenceableValue
                           (*(uint *)absl_log_internal_check_op_result & 1);
      local_98 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
      local_90 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                           (&local_94,&local_98,"rhs_array[0] & 0x1u == 0u");
      if (local_90 != (Nullable<const_char_*>)0x0) {
        pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_90);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0xbe1,pcVar1);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_b0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_99,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_b0);
      }
      absl_log_internal_check_op_result_2._4_4_ =
           internal::ReflectionSchema::InlinedStringIndex
                     (&this->schema_,(FieldDescriptor *)lhs_arena);
      local_c4 = absl::lts_20250127::log_internal::GetReferenceableValue
                           (absl_log_internal_check_op_result_2._4_4_);
      local_c8 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
      local_c0 = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                           (&local_c4,&local_c8,"index > 0u");
      if (local_c0 != (Nullable<const_char_*>)0x0) {
        pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_c0);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0xbe4,pcVar1);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_c9,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_e0);
      }
      if ((lhs_array._6_1_ & 1) == 0) {
        ClearInlinedStringDonated(absl_log_internal_check_op_result_2._4_4_,rhs_array);
        SetInlinedStringDonated
                  (absl_log_internal_check_op_result_2._4_4_,
                   (uint32_t *)absl_log_internal_check_op_result);
      }
      else {
        SetInlinedStringDonated(absl_log_internal_check_op_result_2._4_4_,rhs_array);
        ClearInlinedStringDonated
                  (absl_log_internal_check_op_result_2._4_4_,
                   (uint32_t *)absl_log_internal_check_op_result);
      }
    }
  }
  return;
}

Assistant:

void Reflection::SwapInlinedStringDonated(Message* lhs, Message* rhs,
                                          const FieldDescriptor* field) const {
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  // If arenas differ, inined string fields are swapped by copying values.
  // Donation status should not be swapped.
  if (lhs_arena != rhs_arena) {
    return;
  }
  bool lhs_donated = IsInlinedStringDonated(*lhs, field);
  bool rhs_donated = IsInlinedStringDonated(*rhs, field);
  if (lhs_donated == rhs_donated) {
    return;
  }
  // If one is undonated, both must have already registered ArenaDtor.
  uint32_t* lhs_array = MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = MutableInlinedStringDonatedArray(rhs);
  ABSL_CHECK_EQ(lhs_array[0] & 0x1u, 0u);
  ABSL_CHECK_EQ(rhs_array[0] & 0x1u, 0u);
  // Swap donation status bit.
  uint32_t index = schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  if (rhs_donated) {
    SetInlinedStringDonated(index, lhs_array);
    ClearInlinedStringDonated(index, rhs_array);
  } else {  // lhs_donated
    ClearInlinedStringDonated(index, lhs_array);
    SetInlinedStringDonated(index, rhs_array);
  }
}